

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

void __thiscall
cfd::js::api::json::BlindRawTransactionRequest::ConvertFromStruct
          (BlindRawTransactionRequest *this,BlindRawTransactionRequestStruct *data)

{
  int iVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->tx_);
  core::JsonObjectVector<cfd::js::api::json::BlindTxInRequest,_cfd::js::api::BlindTxInRequestStruct>
  ::ConvertFromStruct(&this->txins_,&data->txins);
  core::
  JsonObjectVector<cfd::js::api::json::BlindTxOutRequest,_cfd::js::api::BlindTxOutRequestStruct>::
  ConvertFromStruct(&this->txouts_,&data->txouts);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->txout_confidential_addresses_,&data->txout_confidential_addresses);
  core::
  JsonObjectVector<cfd::js::api::json::BlindIssuanceRequest,_cfd::js::api::BlindIssuanceRequestStruct>
  ::ConvertFromStruct(&this->issuances_,&data->issuances);
  this->minimum_range_value_ = data->minimum_range_value;
  iVar1 = data->minimum_bits;
  this->exponent_ = data->exponent;
  this->minimum_bits_ = iVar1;
  this->collect_blinder_ = data->collect_blinder;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void BlindRawTransactionRequest::ConvertFromStruct(
    const BlindRawTransactionRequestStruct& data) {
  tx_ = data.tx;
  txins_.ConvertFromStruct(data.txins);
  txouts_.ConvertFromStruct(data.txouts);
  txout_confidential_addresses_.ConvertFromStruct(
      data.txout_confidential_addresses);
  issuances_.ConvertFromStruct(data.issuances);
  minimum_range_value_ = data.minimum_range_value;
  exponent_ = data.exponent;
  minimum_bits_ = data.minimum_bits;
  collect_blinder_ = data.collect_blinder;
  ignore_items = data.ignore_items;
}